

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlParseCharRef(htmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  xmlChar xVar2;
  xmlParserInputPtr pxVar3;
  byte bVar4;
  uint uVar5;
  char cVar6;
  bool bVar7;
  int val;
  xmlChar *pxVar8;
  char *pcVar9;
  xmlParserErrors error;
  uint uVar10;
  
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,5,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,(char *)0x0,
                    0,0,"htmlParseCharRef: context error\n",0,0);
    return 0;
  }
  pxVar3 = ctxt->input;
  if (pxVar3 == (xmlParserInputPtr)0x0) {
    pcVar9 = "htmlParseCharRef: context error\n";
    error = XML_ERR_INTERNAL_ERROR;
LAB_0014afbb:
    htmlParseErr(ctxt,error,pcVar9,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  else {
    pxVar8 = pxVar3->cur;
    if ((*pxVar8 == '&') && (pxVar8[1] == '#')) {
      if ((pxVar8[2] | 0x20) == 0x78) {
        pxVar3->cur = pxVar8 + 3;
        pxVar3->col = pxVar3->col + 3;
        pxVar1 = pxVar8 + 3;
        pxVar8 = (xmlChar *)CONCAT71((int7)((ulong)pxVar8 >> 8),*pxVar1);
        if (*pxVar1 == ';') {
LAB_0014afe9:
          val = (int)pxVar8;
          uVar10 = 0;
        }
        else {
          uVar10 = 0;
          do {
            cVar6 = (char)pxVar8;
            uVar5 = (uint)pxVar8 & 0xff;
            if (9 < (byte)(cVar6 - 0x30U)) {
              if ((byte)(cVar6 + 0x9fU) < 6) {
                if ((int)uVar10 < 0x110000) {
                  uVar10 = (uVar10 * 0x10 + uVar5) - 0x57;
                }
                goto LAB_0014aefc;
              }
              pxVar8 = (xmlChar *)CONCAT71((int7)((ulong)pxVar8 >> 8),cVar6 + 0xbfU);
              if ((byte)(cVar6 + 0xbfU) < 6) {
                if ((int)uVar10 < 0x110000) {
                  uVar10 = (uVar10 * 0x10 + uVar5) - 0x37;
                }
                goto LAB_0014aefc;
              }
              val = 0;
              htmlParseErr(ctxt,XML_ERR_INVALID_HEX_CHARREF,"htmlParseCharRef: missing semicolon\n",
                           (xmlChar *)0x0,(xmlChar *)0x0);
              xVar2 = *ctxt->input->cur;
              pcVar9 = (char *)(ulong)uVar10;
joined_r0x0014b0da:
              if (xVar2 == ';') break;
              goto LAB_0014aff7;
            }
            if ((int)uVar10 < 0x110000) {
              uVar10 = (uVar10 * 0x10 + uVar5) - 0x30;
            }
LAB_0014aefc:
            xmlNextChar(ctxt);
            xVar2 = *ctxt->input->cur;
            pxVar8 = (xmlChar *)CONCAT71((int7)((ulong)pxVar8 >> 8),xVar2);
            val = (int)pxVar8;
          } while (xVar2 != ';');
        }
      }
      else {
        pxVar3->cur = pxVar8 + 2;
        pxVar3->col = pxVar3->col + 2;
        bVar4 = pxVar8[2];
        if (bVar4 == 0x3b) goto LAB_0014afe9;
        pcVar9 = (char *)0x0;
        do {
          uVar5 = (uint)pcVar9;
          if (9 < (byte)(bVar4 - 0x30)) {
            val = 0;
            htmlParseErr(ctxt,XML_ERR_INVALID_DEC_CHARREF,"htmlParseCharRef: missing semicolon\n",
                         (xmlChar *)0x0,(xmlChar *)0x0);
            xVar2 = *ctxt->input->cur;
            uVar10 = uVar5;
            goto joined_r0x0014b0da;
          }
          val = uVar5 * 5;
          uVar10 = (bVar4 - 0x30) + uVar5 * 10;
          if (0x10ffff < (int)uVar5) {
            uVar10 = uVar5;
          }
          xmlNextChar(ctxt);
          bVar4 = *ctxt->input->cur;
          pcVar9 = (char *)(ulong)uVar10;
        } while (bVar4 != 0x3b);
      }
      xmlNextChar(ctxt);
      pcVar9 = (char *)(ulong)uVar10;
LAB_0014aff7:
      uVar5 = (uint)pcVar9;
      if ((int)uVar5 < 0x100) {
        if (0x1f < (int)uVar5) {
          return uVar5;
        }
        if ((uVar5 < 0xe) && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0)) {
          return uVar5;
        }
      }
      else {
        bVar7 = uVar5 - 0xe000 < 0x1ffe || uVar5 < 0xd800;
        val = CONCAT31((int3)(uVar5 - 0xe000 >> 8),bVar7);
        if (uVar5 - 0x10000 < 0x100000 || bVar7) {
          return uVar5;
        }
        if (0x10ffff < uVar5) {
          pcVar9 = "htmlParseCharRef: value too large\n";
          error = XML_ERR_INVALID_CHAR;
          goto LAB_0014afbb;
        }
      }
    }
    else {
      pcVar9 = (char *)0x0;
      val = 0;
      htmlParseErr(ctxt,XML_ERR_INVALID_CHARREF,"htmlParseCharRef: invalid value\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
    }
    htmlParseErrInt(ctxt,0x1f2855,pcVar9,val);
  }
  return 0;
}

Assistant:

int
htmlParseCharRef(htmlParserCtxtPtr ctxt) {
    int val = 0;

    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseCharRef: context error\n",
		     NULL, NULL);
        return(0);
    }
    if ((CUR == '&') && (NXT(1) == '#') &&
        ((NXT(2) == 'x') || NXT(2) == 'X')) {
	SKIP(3);
	while (CUR != ';') {
	    if ((CUR >= '0') && (CUR <= '9')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - '0');
            } else if ((CUR >= 'a') && (CUR <= 'f')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - 'a') + 10;
            } else if ((CUR >= 'A') && (CUR <= 'F')) {
                if (val < 0x110000)
	            val = val * 16 + (CUR - 'A') + 10;
            } else {
	        htmlParseErr(ctxt, XML_ERR_INVALID_HEX_CHARREF,
		             "htmlParseCharRef: missing semicolon\n",
			     NULL, NULL);
		break;
	    }
	    NEXT;
	}
	if (CUR == ';')
	    NEXT;
    } else if  ((CUR == '&') && (NXT(1) == '#')) {
	SKIP(2);
	while (CUR != ';') {
	    if ((CUR >= '0') && (CUR <= '9')) {
                if (val < 0x110000)
	            val = val * 10 + (CUR - '0');
            } else {
	        htmlParseErr(ctxt, XML_ERR_INVALID_DEC_CHARREF,
		             "htmlParseCharRef: missing semicolon\n",
			     NULL, NULL);
		break;
	    }
	    NEXT;
	}
	if (CUR == ';')
	    NEXT;
    } else {
	htmlParseErr(ctxt, XML_ERR_INVALID_CHARREF,
	             "htmlParseCharRef: invalid value\n", NULL, NULL);
    }
    /*
     * Check the value IS_CHAR ...
     */
    if (IS_CHAR(val)) {
        return(val);
    } else if (val >= 0x110000) {
	htmlParseErr(ctxt, XML_ERR_INVALID_CHAR,
		     "htmlParseCharRef: value too large\n", NULL, NULL);
    } else {
	htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
			"htmlParseCharRef: invalid xmlChar value %d\n",
			val);
    }
    return(0);
}